

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_taproot_merkletree.cpp
# Opt level: O0

void __thiscall TaprootScriptTree_Branch2_Test::TestBody(TaprootScriptTree_Branch2_Test *this)

{
  allocator<cfd::core::ByteData256> *this_00;
  initializer_list<cfd::core::ByteData256> __l;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar1
  ;
  bool bVar2;
  char *pcVar3;
  ScriptBuilder *this_01;
  size_type sVar4;
  size_type sVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  reference pvVar7;
  char *in_R9;
  ByteData256 *local_770;
  string local_720;
  AssertHelper local_700;
  Message local_6f8;
  bool local_6e9;
  undefined1 local_6e8 [8];
  AssertionResult gtest_ar__2;
  SchnorrSignature sig;
  Privkey sk;
  SchnorrPubkey pk;
  string local_670;
  undefined1 local_650 [8];
  ByteData256 msg;
  AssertHelper local_618;
  Message local_610;
  undefined1 local_608 [8];
  AssertionResult gtest_ar__1;
  Message local_5f0;
  Privkey local_5e8;
  string local_5c8;
  undefined1 local_5a8 [8];
  AssertionResult gtest_ar_8;
  Message local_590;
  SchnorrPubkey local_588;
  string local_570;
  undefined1 local_550 [8];
  AssertionResult gtest_ar_7;
  Message local_538;
  ByteData256 local_530;
  string local_518;
  undefined1 local_4f8 [8];
  AssertionResult gtest_ar_6;
  Message local_4e0;
  ByteData256 local_4d8;
  string local_4c0;
  undefined1 local_4a0 [8];
  AssertionResult gtest_ar_5;
  bool parity;
  Message local_480;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_478;
  string local_460;
  string local_440;
  undefined1 local_420 [8];
  AssertionResult gtest_ar_4;
  size_t index;
  AssertHelper local_3f0;
  Message local_3e8;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_3e0;
  size_type local_3c8;
  size_type local_3c0;
  undefined1 local_3b8 [8];
  AssertionResult gtest_ar_3;
  Message local_3a0;
  Script local_398;
  string local_360;
  string local_340;
  undefined1 local_320 [8];
  AssertionResult gtest_ar_2;
  Message local_308;
  uint8_t local_2f9;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar_1;
  ByteData256 *node;
  iterator __end1;
  iterator __begin1;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *__range1;
  TaprootScriptTree tree;
  string local_228;
  allocator local_201;
  string local_200;
  ByteData256 *local_1e0;
  ByteData256 local_1d8;
  ByteData256 local_1c0;
  undefined1 local_1a8 [24];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> nodes;
  undefined1 local_178 [7];
  uint8_t leaf_version;
  undefined1 local_158 [8];
  Script script;
  AssertHelper local_100;
  Message local_f8;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_;
  Message local_d8;
  string local_d0;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar;
  SchnorrPubkey schnorr_pubkey;
  undefined1 local_80 [7];
  bool is_parity;
  Pubkey pubkey;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  Privkey key;
  TaprootScriptTree_Branch2_Test *this_local;
  
  key._24_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_50,"dd43698cf5f96d33bf895c28d67b5ffbd736c2d4cef91e1f8ce0e38c31a709c8",
             &local_51);
  cfd::core::Privkey::Privkey((Privkey *)local_30,&local_50,kMainnet,true);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  cfd::core::Privkey::GeneratePubkey((Pubkey *)local_80,(Privkey *)local_30,true);
  schnorr_pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  cfd::core::SchnorrPubkey::FromPubkey
            ((SchnorrPubkey *)&gtest_ar.message_,(Pubkey *)local_80,
             (bool *)((long)&schnorr_pubkey.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_d0,(SchnorrPubkey *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
            ((EqHelper<false> *)local_b0,
             "\"ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440\"",
             "schnorr_pubkey.GetHex()",
             (char (*) [65])"ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440",
             &local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar2) {
    testing::Message::Message(&local_d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xb6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_f0,
             (bool *)((long)&schnorr_pubkey.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7),(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar2) {
    testing::Message::Message(&local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &script.script_stack_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_f0,
               (AssertionResult *)"is_parity","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xb7,pcVar3);
    testing::internal::AssertHelper::operator=(&local_100,&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    std::__cxx11::string::~string
              ((string *)
               &script.script_stack_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  cfd::core::ScriptBuilder::ScriptBuilder((ScriptBuilder *)local_178);
  this_01 = cfd::core::ScriptBuilder::operator<<
                      ((ScriptBuilder *)local_178,
                       (ScriptOperator *)cfd::core::ScriptOperator::OP_TRUE);
  cfd::core::ScriptBuilder::Build((Script *)local_158,this_01);
  cfd::core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)local_178);
  nodes.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0xc4;
  tree.nodes_.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  local_1e0 = &local_1d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_200,"4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d"
             ,&local_201);
  cfd::core::ByteData256::ByteData256(&local_1d8,&local_200);
  local_1e0 = &local_1c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_228,"dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d57"
             ,(allocator *)
              ((long)&tree.nodes_.
                      super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData256::ByteData256(&local_1c0,&local_228);
  tree.nodes_.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  local_1a8._0_8_ = &local_1d8;
  local_1a8._8_8_ = (pointer)0x2;
  this_00 = (allocator<cfd::core::ByteData256> *)
            ((long)&tree.nodes_.
                    super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<cfd::core::ByteData256>::allocator(this_00);
  __l._M_len = local_1a8._8_8_;
  __l._M_array = (iterator)local_1a8._0_8_;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             (local_1a8 + 0x10),__l,this_00);
  std::allocator<cfd::core::ByteData256>::~allocator
            ((allocator<cfd::core::ByteData256> *)
             ((long)&tree.nodes_.
                     super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  local_770 = (ByteData256 *)local_1a8;
  do {
    local_770 = local_770 + -1;
    cfd::core::ByteData256::~ByteData256(local_770);
  } while (local_770 != &local_1d8);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&tree.nodes_.
                     super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  cfd::core::TaprootScriptTree::TaprootScriptTree
            ((TaprootScriptTree *)&__range1,
             nodes.
             super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_,(Script *)local_158);
  __end1 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::begin
                     ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                      (local_1a8 + 0x10));
  node = (ByteData256 *)
         std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::end
                   ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                    (local_1a8 + 0x10));
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cfd::core::ByteData256_*,_std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>_>
                                     *)&node), bVar2) {
    gtest_ar_1.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         __gnu_cxx::
         __normal_iterator<cfd::core::ByteData256_*,_std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>_>
         ::operator*(&__end1);
    cfd::core::TaprootScriptTree::AddBranch
              ((TaprootScriptTree *)&__range1,(ByteData256 *)gtest_ar_1.message_.ptr_);
    __gnu_cxx::
    __normal_iterator<cfd::core::ByteData256_*,_std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>_>
    ::operator++(&__end1);
  }
  local_2f9 = cfd::core::TapBranch::GetLeafVersion((TapBranch *)&__range1);
  testing::internal::EqHelper<false>::Compare<unsigned_char,unsigned_char>
            ((EqHelper<false> *)local_2f8,"leaf_version","tree.GetLeafVersion()",
             (uchar *)((long)&nodes.
                              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),&local_2f9);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
  if (!bVar2) {
    testing::Message::Message(&local_308);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xc4,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_308);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_308);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
  cfd::core::Script::GetHex_abi_cxx11_(&local_340,(Script *)local_158);
  cfd::core::TapBranch::GetScript(&local_398,(TapBranch *)&__range1);
  cfd::core::Script::GetHex_abi_cxx11_(&local_360,&local_398);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_320,"script.GetHex()","tree.GetScript().GetHex()",&local_340,
             &local_360);
  std::__cxx11::string::~string((string *)&local_360);
  cfd::core::Script::~Script(&local_398);
  std::__cxx11::string::~string((string *)&local_340);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
  if (!bVar2) {
    testing::Message::Message(&local_3a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_320);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xc5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_3a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
  local_3c0 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::size
                        ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                         (local_1a8 + 0x10));
  cfd::core::TaprootScriptTree::GetNodeList(&local_3e0,(TaprootScriptTree *)&__range1);
  local_3c8 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::size
                        (&local_3e0);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_3b8,"nodes.size()","tree.GetNodeList().size()",&local_3c0,
             &local_3c8);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_3e0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b8);
  if (!bVar2) {
    testing::Message::Message(&local_3e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_3f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xc6,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3f0,&local_3e8);
    testing::internal::AssertHelper::~AssertHelper(&local_3f0);
    testing::Message::~Message(&local_3e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b8);
  sVar4 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::size
                    ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                     (local_1a8 + 0x10));
  cfd::core::TaprootScriptTree::GetNodeList
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&index,
             (TaprootScriptTree *)&__range1);
  sVar5 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::size
                    ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                     &index);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&index);
  if (sVar4 == sVar5) {
    for (gtest_ar_4.message_.ptr_ =
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        sVar1.ptr_ = gtest_ar_4.message_.ptr_,
        pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::size
                           ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                             *)(local_1a8 + 0x10)), sVar1.ptr_ < pbVar6;
        gtest_ar_4.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &(gtest_ar_4.message_.ptr_)->field_0x1) {
      pvVar7 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
               operator[]((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *
                          )(local_1a8 + 0x10),(size_type)gtest_ar_4.message_.ptr_);
      cfd::core::ByteData256::GetHex_abi_cxx11_(&local_440,pvVar7);
      cfd::core::TaprootScriptTree::GetNodeList(&local_478,(TaprootScriptTree *)&__range1);
      pvVar7 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
               operator[](&local_478,(size_type)gtest_ar_4.message_.ptr_);
      cfd::core::ByteData256::GetHex_abi_cxx11_(&local_460,pvVar7);
      testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
                ((EqHelper<false> *)local_420,"nodes[index].GetHex()",
                 "tree.GetNodeList()[index].GetHex()",&local_440,&local_460);
      std::__cxx11::string::~string((string *)&local_460);
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_478);
      std::__cxx11::string::~string((string *)&local_440);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
      if (!bVar2) {
        testing::Message::Message(&local_480);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_420);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffb78,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
                   ,0xc9,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffb78,&local_480);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffb78);
        testing::Message::~Message(&local_480);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_420);
    }
  }
  gtest_ar_5.message_.ptr_._7_1_ = 0;
  cfd::core::TaprootScriptTree::GetTapLeafHash(&local_4d8,(TaprootScriptTree *)&__range1);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_4c0,&local_4d8);
  testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
            ((EqHelper<false> *)local_4a0,
             "\"b893df7b9b277874f3427de6af5a8d9b1ba5ba6be139557d7a1db9cc4a4e5dae\"",
             "tree.GetTapLeafHash().GetHex()",
             (char (*) [65])"b893df7b9b277874f3427de6af5a8d9b1ba5ba6be139557d7a1db9cc4a4e5dae",
             &local_4c0);
  std::__cxx11::string::~string((string *)&local_4c0);
  cfd::core::ByteData256::~ByteData256(&local_4d8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a0);
  if (!bVar2) {
    testing::Message::Message(&local_4e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xce,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_4e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_4e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a0);
  cfd::core::TapBranch::GetCurrentBranchHash(&local_530,(TapBranch *)&__range1);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_518,&local_530);
  testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
            ((EqHelper<false> *)local_4f8,
             "\"dc650bb6e95f7ee50dfbddf68651f77cd78c68f8f6c0c64014e5ef7c829c3635\"",
             "tree.GetCurrentBranchHash().GetHex()",
             (char (*) [65])"dc650bb6e95f7ee50dfbddf68651f77cd78c68f8f6c0c64014e5ef7c829c3635",
             &local_518);
  std::__cxx11::string::~string((string *)&local_518);
  cfd::core::ByteData256::~ByteData256(&local_530);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f8);
  if (!bVar2) {
    testing::Message::Message(&local_538);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xd0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_538);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_538);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f8);
  cfd::core::TapBranch::GetTweakedPubkey
            (&local_588,(TapBranch *)&__range1,(SchnorrPubkey *)&gtest_ar.message_,(bool *)0x0);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_570,&local_588);
  testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
            ((EqHelper<false> *)local_550,
             "\"300af27b4b5d270ec1ccc147210af5904724ef72d3ead21c569564a1536d33a3\"",
             "tree.GetTweakedPubkey(schnorr_pubkey).GetHex()",
             (char (*) [65])"300af27b4b5d270ec1ccc147210af5904724ef72d3ead21c569564a1536d33a3",
             &local_570);
  std::__cxx11::string::~string((string *)&local_570);
  cfd::core::SchnorrPubkey::~SchnorrPubkey(&local_588);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_550);
  if (!bVar2) {
    testing::Message::Message(&local_590);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_550);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xd2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_590);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_590);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_550);
  cfd::core::TapBranch::GetTweakedPrivkey
            (&local_5e8,(TapBranch *)&__range1,(Privkey *)local_30,
             (bool *)((long)&gtest_ar_5.message_.ptr_ + 7));
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_5c8,&local_5e8);
  testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
            ((EqHelper<false> *)local_5a8,
             "\"7801a8819654c6c31f5a7cbd152f881a138e2adfc64da9dc1f78fbf80640f53a\"",
             "tree.GetTweakedPrivkey(key, &parity).GetHex()",
             (char (*) [65])"7801a8819654c6c31f5a7cbd152f881a138e2adfc64da9dc1f78fbf80640f53a",
             &local_5c8);
  std::__cxx11::string::~string((string *)&local_5c8);
  cfd::core::Privkey::~Privkey(&local_5e8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5a8);
  if (!bVar2) {
    testing::Message::Message(&local_5f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_5a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xd4,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_5f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_5f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5a8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_608,(bool *)((long)&gtest_ar_5.message_.ptr_ + 7),(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_608);
  if (!bVar2) {
    testing::Message::Message(&local_610);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &msg.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(internal *)local_608,
               (AssertionResult *)0x6e33c4,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_618,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xd5,pcVar3);
    testing::internal::AssertHelper::operator=(&local_618,&local_610);
    testing::internal::AssertHelper::~AssertHelper(&local_618);
    std::__cxx11::string::~string
              ((string *)
               &msg.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_610);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_608);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_670,"e5b11ddceab1e4fc49a8132ae589a39b07acf49cabb2b0fbf6104bc31da12c02"
             ,(allocator *)
              ((long)&pk.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData256::ByteData256((ByteData256 *)local_650,&local_670);
  std::__cxx11::string::~string((string *)&local_670);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pk.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::TapBranch::GetTweakedPubkey
            ((SchnorrPubkey *)&sk.is_compressed_,(TapBranch *)&__range1,
             (SchnorrPubkey *)&gtest_ar.message_,(bool *)0x0);
  cfd::core::TapBranch::GetTweakedPrivkey
            ((Privkey *)&sig.sighash_type_.is_anyone_can_pay_,(TapBranch *)&__range1,
             (Privkey *)local_30,(bool *)0x0);
  cfd::core::SchnorrUtil::Sign
            ((SchnorrSignature *)&gtest_ar__2.message_,(ByteData256 *)local_650,
             (Privkey *)&sig.sighash_type_.is_anyone_can_pay_);
  local_6e9 = cfd::core::SchnorrPubkey::Verify
                        ((SchnorrPubkey *)&sk.is_compressed_,
                         (SchnorrSignature *)&gtest_ar__2.message_,(ByteData256 *)local_650);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6e8,&local_6e9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6e8);
  if (!bVar2) {
    testing::Message::Message(&local_6f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_720,(internal *)local_6e8,(AssertionResult *)"pk.Verify(sig, msg)","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_700,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xdb,pcVar3);
    testing::internal::AssertHelper::operator=(&local_700,&local_6f8);
    testing::internal::AssertHelper::~AssertHelper(&local_700);
    std::__cxx11::string::~string((string *)&local_720);
    testing::Message::~Message(&local_6f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6e8);
  cfd::core::SchnorrSignature::~SchnorrSignature((SchnorrSignature *)&gtest_ar__2.message_);
  cfd::core::Privkey::~Privkey((Privkey *)&sig.sighash_type_.is_anyone_can_pay_);
  cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)&sk.is_compressed_);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)local_650);
  cfd::core::TaprootScriptTree::~TaprootScriptTree((TaprootScriptTree *)&__range1);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             (local_1a8 + 0x10));
  cfd::core::Script::~Script((Script *)local_158);
  cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)&gtest_ar.message_);
  cfd::core::Pubkey::~Pubkey((Pubkey *)local_80);
  cfd::core::Privkey::~Privkey((Privkey *)local_30);
  return;
}

Assistant:

TEST(TaprootScriptTree, Branch2) {
  Privkey key("dd43698cf5f96d33bf895c28d67b5ffbd736c2d4cef91e1f8ce0e38c31a709c8");
  Pubkey pubkey = key.GeneratePubkey();
  bool is_parity = false;
  SchnorrPubkey schnorr_pubkey = SchnorrPubkey::FromPubkey(pubkey, &is_parity);
  EXPECT_EQ("ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440",
      schnorr_pubkey.GetHex());
  EXPECT_TRUE(is_parity);

  Script script = (ScriptBuilder() << ScriptOperator::OP_TRUE).Build();
  uint8_t leaf_version = 0xc4;
  std::vector<ByteData256> nodes = {
    ByteData256("4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d"),
    ByteData256("dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d57")
  };
  TaprootScriptTree tree(leaf_version, script);
  for (const auto& node : nodes) {
    tree.AddBranch(node);
  }

  EXPECT_EQ(leaf_version, tree.GetLeafVersion());
  EXPECT_EQ(script.GetHex(), tree.GetScript().GetHex());
  EXPECT_EQ(nodes.size(), tree.GetNodeList().size());
  if (nodes.size() == tree.GetNodeList().size()) {
    for (size_t index=0; index<nodes.size(); ++index) {
      EXPECT_EQ(nodes[index].GetHex(), tree.GetNodeList()[index].GetHex());
    }
  }
  bool parity = false;
  EXPECT_EQ("b893df7b9b277874f3427de6af5a8d9b1ba5ba6be139557d7a1db9cc4a4e5dae",
      tree.GetTapLeafHash().GetHex());
  EXPECT_EQ("dc650bb6e95f7ee50dfbddf68651f77cd78c68f8f6c0c64014e5ef7c829c3635",
      tree.GetCurrentBranchHash().GetHex());
  EXPECT_EQ("300af27b4b5d270ec1ccc147210af5904724ef72d3ead21c569564a1536d33a3",
      tree.GetTweakedPubkey(schnorr_pubkey).GetHex());
  EXPECT_EQ("7801a8819654c6c31f5a7cbd152f881a138e2adfc64da9dc1f78fbf80640f53a",
      tree.GetTweakedPrivkey(key, &parity).GetHex());
  EXPECT_TRUE(parity);

  ByteData256 msg("e5b11ddceab1e4fc49a8132ae589a39b07acf49cabb2b0fbf6104bc31da12c02");
  auto pk = tree.GetTweakedPubkey(schnorr_pubkey);
  auto sk = tree.GetTweakedPrivkey(key);
  auto sig = SchnorrUtil::Sign(msg, sk);
  EXPECT_TRUE(pk.Verify(sig, msg));
}